

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

xmlEntityPtr xmlParseEntityRef(xmlParserCtxtPtr ctxt)

{
  xmlChar *name_00;
  xmlChar *name;
  xmlParserCtxtPtr ctxt_local;
  
  if (ctxt == (xmlParserCtxtPtr)0x0) {
    ctxt_local = (xmlParserCtxtPtr)0x0;
  }
  else {
    name_00 = xmlParseEntityRefInternal(ctxt);
    if (name_00 == (xmlChar *)0x0) {
      ctxt_local = (xmlParserCtxtPtr)0x0;
    }
    else {
      ctxt_local = (xmlParserCtxtPtr)xmlLookupGeneralEntity(ctxt,name_00,0);
    }
  }
  return (xmlEntityPtr)ctxt_local;
}

Assistant:

xmlEntityPtr
xmlParseEntityRef(xmlParserCtxtPtr ctxt) {
    const xmlChar *name;

    if (ctxt == NULL)
        return(NULL);

    name = xmlParseEntityRefInternal(ctxt);
    if (name == NULL)
        return(NULL);

    return(xmlLookupGeneralEntity(ctxt, name, /* inAttr */ 0));
}